

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O2

ai_real __thiscall Assimp::XFileParser::ReadFloat(XFileParser *this)

{
  unsigned_short uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  double *pdVar5;
  long lVar6;
  float fVar7;
  ai_real result;
  
  if (this->mIsBinaryFormat == true) {
    uVar2 = this->mBinaryNumCount;
    if ((uVar2 == 0) && (uVar2 = 0, 1 < (long)this->mEnd - (long)this->mP)) {
      uVar1 = ReadBinWord(this);
      uVar2 = 1;
      if ((uVar1 == 7) && (3 < (long)this->mEnd - (long)this->mP)) {
        uVar2 = ReadBinDWord(this);
      }
    }
    this->mBinaryNumCount = uVar2 - 1;
    pdVar5 = (double *)this->mP;
    lVar6 = (long)this->mEnd - (long)pdVar5;
    if (this->mBinaryFloatSize == 8) {
      if (lVar6 < 8) {
LAB_0052d4f8:
        this->mP = this->mEnd;
        goto LAB_0052d4fc;
      }
      fVar7 = (float)*pdVar5;
      pdVar5 = pdVar5 + 1;
    }
    else {
      if (lVar6 < 4) goto LAB_0052d4f8;
      fVar7 = *(float *)pdVar5;
      pdVar5 = (double *)((long)pdVar5 + 4);
    }
    this->mP = (char *)pdVar5;
  }
  else {
    FindNextNoneWhiteSpace(this);
    pcVar4 = this->mP;
    iVar3 = strncmp(pcVar4,"-1.#IND00",9);
    if ((iVar3 == 0) || (iVar3 = strncmp(pcVar4,"1.#IND00",8), iVar3 == 0)) {
      pcVar4 = pcVar4 + 9;
    }
    else {
      iVar3 = strncmp(pcVar4,"1.#QNAN0",8);
      if (iVar3 != 0) {
        result = 0.0;
        pcVar4 = fast_atoreal_move<float>(pcVar4,&result,true);
        this->mP = pcVar4;
        CheckForSeparator(this);
        return result;
      }
      pcVar4 = pcVar4 + 8;
    }
    this->mP = pcVar4;
    CheckForSeparator(this);
LAB_0052d4fc:
    fVar7 = 0.0;
  }
  return fVar7;
}

Assistant:

ai_real XFileParser::ReadFloat()
{
    if( mIsBinaryFormat)
    {
        if( mBinaryNumCount == 0 && mEnd - mP >= 2)
        {
            unsigned short tmp = ReadBinWord(); // 0x07 or 0x42
            if( tmp == 0x07 && mEnd - mP >= 4) // array of floats following
                mBinaryNumCount = ReadBinDWord();
            else // single float following
                mBinaryNumCount = 1;
        }

        --mBinaryNumCount;
        if( mBinaryFloatSize == 8) {
            if( mEnd - mP >= 8) {
                double res;
                ::memcpy( &res, mP, 8 );
                mP += 8;
                const ai_real result( static_cast<ai_real>( res ) );
                return result;
            } else {
                mP = mEnd;
                return 0;
            }
        } else {
            if( mEnd - mP >= 4) {
                ai_real result;
                ::memcpy( &result, mP, 4 );
                mP += 4;
                return result;
            } else {
                mP = mEnd;
                return 0;
            }
        }
    }

    // text version
    FindNextNoneWhiteSpace();
    // check for various special strings to allow reading files from faulty exporters
    // I mean you, Blender!
    // Reading is safe because of the terminating zero
    if( strncmp( mP, "-1.#IND00", 9) == 0 || strncmp( mP, "1.#IND00", 8) == 0)
    {
        mP += 9;
        CheckForSeparator();
        return 0.0;
    } else
    if( strncmp( mP, "1.#QNAN0", 8) == 0)
    {
        mP += 8;
        CheckForSeparator();
        return 0.0;
    }

    ai_real result = 0.0;
    mP = fast_atoreal_move<ai_real>( mP, result);

    CheckForSeparator();

    return result;
}